

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string *name,bool expecting_enum)

{
  Symbol SVar1;
  string lookup_name;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)&lookup_name,(string *)name);
  if ((lookup_name._M_string_length != 0) && (*lookup_name._M_dataplus._M_p == '.')) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)&lookup_name);
    std::__cxx11::string::operator=((string *)&lookup_name,local_30);
    std::__cxx11::string::~string(local_30);
  }
  SVar1 = Tables::FindByNameHelper
                    ((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,this,&lookup_name);
  std::__cxx11::string::~string((string *)&lookup_name);
  SVar1._4_4_ = 0;
  return SVar1;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(const std::string& name,
                                               bool expecting_enum) const {
  std::string lookup_name = name;
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}